

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void change_calls(gen_ctx_t gen_ctx,uint8_t *base)

{
  MIR_context_t ctx_00;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint8_t local_66 [6];
  long lStack_60;
  uint8_t rel_insn [6];
  int64_t off;
  uint64_t v;
  const_ref_t cr;
  size_t i;
  MIR_context_t ctx;
  uint8_t *base_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  cr.const_num = 0;
  do {
    sVar1 = cr.const_num;
    sVar3 = VARR_const_ref_tlength(gen_ctx->target_ctx->const_refs);
    if (sVar3 <= sVar1) {
      return;
    }
    VARR_const_ref_tget((const_ref_t *)&v,gen_ctx->target_ctx->const_refs,cr.const_num);
    if ((int)v != 0) {
      if (base[(long)&cr.func_item[-1].u.func + 6] != 0xff) {
        __assert_fail("base[cr.pc - 2] == 0xff",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb88,"void change_calls(gen_ctx_t, uint8_t *)");
      }
      if ((base[(long)&cr.func_item[-1].u.func + 7] != '\x15') &&
         (base[(long)&cr.func_item[-1].u.func + 7] != '%')) {
        __assert_fail("base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb89,"void change_calls(gen_ctx_t, uint8_t *)");
      }
      if (cr._0_8_ != 0) {
        store_call_ref(gen_ctx,(MIR_item_t)cr._0_8_,base + (long)cr.func_item + -2);
      }
      uVar4 = VARR_uint64_tget(gen_ctx->target_ctx->const_pool,cr.next_insn_disp);
      lStack_60 = uVar4 - (long)(base + cr.pc);
      iVar2 = int32_p(lStack_60);
      if (iVar2 != 0) {
        local_66[0] = '@';
        local_66[1] = 0xe8;
        local_66[2] = '\0';
        local_66[3] = '\0';
        local_66[4] = '\0';
        local_66[5] = '\0';
        if (base[(long)&cr.func_item[-1].u.func + 7] == '%') {
          local_66[0] = '@';
          local_66[1] = 0xe9;
          local_66[2] = '\0';
          local_66[3] = '\0';
        }
        set_int64(local_66 + 2,lStack_60,4);
        _MIR_change_code(ctx_00,base + (long)cr.func_item + -2,local_66,6);
      }
    }
    cr.const_num = cr.const_num + 1;
  } while( true );
}

Assistant:

static void change_calls (gen_ctx_t gen_ctx, uint8_t *base) {
  MIR_context_t ctx = gen_ctx->ctx;
  /* changing calls to rel32 calls: */
  for (size_t i = 0; i < VARR_LENGTH (const_ref_t, const_refs); i++) {
    const_ref_t cr = VARR_GET (const_ref_t, const_refs, i);
    if (!cr.call_p) continue;
    gen_assert (base[cr.pc - 2] == 0xff);
    gen_assert (base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25);
    if (cr.func_item != NULL) store_call_ref (gen_ctx, cr.func_item, (uint8_t *) base + cr.pc - 2);
    uint64_t v = VARR_GET (uint64_t, const_pool, cr.const_num);
    int64_t off = (int64_t) v - (int64_t) (base + cr.next_insn_disp);
    if (!int32_p (off)) continue;
    uint8_t rel_insn[] = {0x40, 0xe8, 0, 0, 0, 0};   /* rex call rel32 */
    if (base[cr.pc - 1] == 0x25) rel_insn[1] = 0xe9; /* rex jmp rel32 */
    set_int64 (rel_insn + 2, off, 4);
    _MIR_change_code (ctx, (uint8_t *) base + cr.pc - 2, (uint8_t *) rel_insn, 6);
  }
}